

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

double estimate<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,void(*)(std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&,unsigned_long)>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *v,
                 set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *t,
                 _func_void_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_ptr_unsigned_long
                 *f)

{
  bool bVar1;
  reference puVar2;
  rep rVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  time_point end;
  unsigned_long i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  time_point start;
  _func_void_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_ptr_unsigned_long
  *f_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *t_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_local;
  
  start.__d.__r = (duration)(duration)f;
  __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::chrono::_V2::system_clock::now();
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(v);
  i = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&i);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    end.__d.__r = (duration)*puVar2;
    (*(code *)start.__d.__r)(t,end.__d.__r);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  local_50.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_60.__r = (rep_conflict)
                 std::chrono::operator-
                           (&local_50,
                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&__range1);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_58,&local_60);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_58);
  return rVar3;
}

Assistant:

double estimate(std::vector<std::uint64_t> &v, Tree &t, Functor f) {
  auto start = std::chrono::system_clock::now();
  for (auto i : v)
    f(t, i);
  auto end = std::chrono::system_clock::now();

  return std::chrono::duration<double>(end - start).count();
}